

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void col_txfm_16x16_rounding(__m128i *in,int shift)

{
  int in_ESI;
  __m128i *in_RDI;
  
  col_txfm_8x8_rounding(in_RDI,in_ESI);
  col_txfm_8x8_rounding(in_RDI + 0x10,in_ESI);
  col_txfm_8x8_rounding(in_RDI + 0x20,in_ESI);
  col_txfm_8x8_rounding(in_RDI + 0x30,in_ESI);
  return;
}

Assistant:

static void col_txfm_16x16_rounding(__m128i *in, int shift) {
  // Note:
  //  We split 16x16 rounding into 4 sections of 8x8 rounding,
  //  instead of 4 columns
  col_txfm_8x8_rounding(&in[0], shift);
  col_txfm_8x8_rounding(&in[16], shift);
  col_txfm_8x8_rounding(&in[32], shift);
  col_txfm_8x8_rounding(&in[48], shift);
}